

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_fre.cc
# Opt level: O3

void ASN1_item_ex_free(ASN1_VALUE **pval,ASN1_ITEM *it)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ASN1_VALUE **ppAVar5;
  long lVar6;
  code *UNRECOVERED_JUMPTABLE;
  long lVar7;
  long lVar8;
  ASN1_TEMPLATE *pAVar9;
  
  if (pval == (ASN1_VALUE **)0x0) {
    return;
  }
  if (it->itype == '\0') {
    if ((ASN1_TEMPLATE *)it->utype != (ASN1_TEMPLATE *)0x0) {
      ASN1_template_free(pval,(ASN1_TEMPLATE *)it->utype);
      return;
    }
switchD_004464d1_caseD_5:
    ASN1_primitive_free(pval,it);
    return;
  }
  if (*pval == (ASN1_VALUE *)0x0) {
    return;
  }
  switch(it->itype) {
  case '\x01':
    iVar3 = asn1_refcount_dec_and_test_zero((ASN1_VALUE **)pval,(ASN1_ITEM *)it);
    if (iVar3 == 0) {
      return;
    }
    bVar2 = true;
    if ((it->tcount == 0) ||
       (UNRECOVERED_JUMPTABLE = *(code **)(it->tcount + 0x10), UNRECOVERED_JUMPTABLE == (code *)0x0)
       ) {
      UNRECOVERED_JUMPTABLE = (code *)0x0;
    }
    else {
      bVar2 = false;
      iVar3 = (*UNRECOVERED_JUMPTABLE)(2,pval,it,0);
      if (iVar3 == 2) {
        return;
      }
    }
    asn1_enc_free(pval,it);
    uVar4 = *(int *)&it->templates - 1;
    if (-1 < (int)uVar4) {
      lVar6 = (ulong)uVar4 << 5;
      lVar7 = (ulong)uVar4 + 1;
      do {
        pAVar9 = asn1_do_adb(pval,(ASN1_TEMPLATE *)(it->utype + lVar6),0);
        if (pAVar9 != (ASN1_TEMPLATE *)0x0) {
          ppAVar5 = asn1_get_field_ptr(pval,pAVar9);
          ASN1_template_free(ppAVar5,pAVar9);
        }
        lVar6 = lVar6 + -0x20;
        lVar8 = lVar7 + -1;
        bVar1 = 0 < lVar7;
        lVar7 = lVar8;
      } while (lVar8 != 0 && bVar1);
    }
    break;
  case '\x02':
    bVar2 = true;
    if ((it->tcount == 0) ||
       (UNRECOVERED_JUMPTABLE = *(code **)(it->tcount + 0x10), UNRECOVERED_JUMPTABLE == (code *)0x0)
       ) {
      UNRECOVERED_JUMPTABLE = (code *)0x0;
    }
    else {
      bVar2 = false;
      iVar3 = (*UNRECOVERED_JUMPTABLE)(2,pval,it,0);
      if (iVar3 == 2) {
        return;
      }
    }
    uVar4 = asn1_get_choice_selector(pval,it);
    if ((-1 < (int)uVar4) && ((long)(ulong)uVar4 < (long)it->templates)) {
      pAVar9 = (ASN1_TEMPLATE *)((ulong)uVar4 * 0x20 + it->utype);
      ppAVar5 = asn1_get_field_ptr(pval,pAVar9);
      ASN1_template_free(ppAVar5,pAVar9);
    }
    break;
  default:
    goto switchD_004464d1_caseD_3;
  case '\x04':
    if (it->tcount == 0) {
      return;
    }
    UNRECOVERED_JUMPTABLE = *(code **)(it->tcount + 8);
    if (UNRECOVERED_JUMPTABLE == (code *)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)(pval,it);
    return;
  case '\x05':
    goto switchD_004464d1_caseD_5;
  }
  if (!bVar2) {
    (*UNRECOVERED_JUMPTABLE)(3,pval,it,0);
  }
  OPENSSL_free(*pval);
  *pval = (ASN1_VALUE *)0x0;
switchD_004464d1_caseD_3:
  return;
}

Assistant:

void ASN1_item_ex_free(ASN1_VALUE **pval, const ASN1_ITEM *it) {
  if (!pval) {
    return;
  }
  if ((it->itype != ASN1_ITYPE_PRIMITIVE) && !*pval) {
    return;
  }

  switch (it->itype) {
    case ASN1_ITYPE_PRIMITIVE:
      if (it->templates) {
        ASN1_template_free(pval, it->templates);
      } else {
        ASN1_primitive_free(pval, it);
      }
      break;

    case ASN1_ITYPE_MSTRING:
      ASN1_primitive_free(pval, it);
      break;

    case ASN1_ITYPE_CHOICE: {
      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb) {
        if (asn1_cb(ASN1_OP_FREE_PRE, pval, it, NULL) == 2) {
          return;
        }
      }
      int i = asn1_get_choice_selector(pval, it);
      if ((i >= 0) && (i < it->tcount)) {
        const ASN1_TEMPLATE *tt = it->templates + i;
        ASN1_VALUE **pchval = asn1_get_field_ptr(pval, tt);
        ASN1_template_free(pchval, tt);
      }
      if (asn1_cb) {
        asn1_cb(ASN1_OP_FREE_POST, pval, it, NULL);
      }
      OPENSSL_free(*pval);
      *pval = NULL;
      break;
    }

    case ASN1_ITYPE_EXTERN: {
      const ASN1_EXTERN_FUNCS *ef =
          reinterpret_cast<const ASN1_EXTERN_FUNCS *>(it->funcs);
      if (ef && ef->asn1_ex_free) {
        ef->asn1_ex_free(pval, it);
      }
      break;
    }

    case ASN1_ITYPE_SEQUENCE: {
      if (!asn1_refcount_dec_and_test_zero(pval, it)) {
        return;
      }
      const ASN1_AUX *aux = reinterpret_cast<const ASN1_AUX *>(it->funcs);
      ASN1_aux_cb *asn1_cb = aux != NULL ? aux->asn1_cb : NULL;
      if (asn1_cb) {
        if (asn1_cb(ASN1_OP_FREE_PRE, pval, it, NULL) == 2) {
          return;
        }
      }
      asn1_enc_free(pval, it);
      // If we free up as normal we will invalidate any ANY DEFINED BY
      // field and we wont be able to determine the type of the field it
      // defines. So free up in reverse order.
      for (int i = it->tcount - 1; i >= 0; i--) {
        const ASN1_TEMPLATE *seqtt = asn1_do_adb(pval, &it->templates[i], 0);
        if (!seqtt) {
          continue;
        }
        ASN1_VALUE **pseqval = asn1_get_field_ptr(pval, seqtt);
        ASN1_template_free(pseqval, seqtt);
      }
      if (asn1_cb) {
        asn1_cb(ASN1_OP_FREE_POST, pval, it, NULL);
      }
      OPENSSL_free(*pval);
      *pval = NULL;
      break;
    }
  }
}